

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void var_add(LexState *ls,BCReg nvars)

{
  ushort uVar1;
  FuncState *pFVar2;
  VarInfo *pVVar3;
  VarInfo *v;
  BCReg nactvar;
  FuncState *fs;
  BCReg nvars_local;
  LexState *ls_local;
  
  pFVar2 = ls->fs;
  v._4_4_ = pFVar2->nactvar;
  fs._4_4_ = nvars;
  while (fs._4_4_ != 0) {
    pVVar3 = ls->vstack;
    uVar1 = pFVar2->varmap[v._4_4_];
    pVVar3[uVar1].startpc = pFVar2->pc;
    pVVar3[uVar1].slot = (uint8_t)v._4_4_;
    pVVar3[uVar1].info = '\0';
    v._4_4_ = v._4_4_ + 1;
    fs._4_4_ = fs._4_4_ - 1;
  }
  pFVar2->nactvar = v._4_4_;
  return;
}

Assistant:

static void var_add(LexState *ls, BCReg nvars)
{
  FuncState *fs = ls->fs;
  BCReg nactvar = fs->nactvar;
  while (nvars--) {
    VarInfo *v = &var_get(ls, fs, nactvar);
    v->startpc = fs->pc;
    v->slot = nactvar++;
    v->info = 0;
  }
  fs->nactvar = nactvar;
}